

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O1

void __thiscall
Reflection::StructImpl<CPU::Z80::State::ExecutionState>::set
          (StructImpl<CPU::Z80::State::ExecutionState> *this,string *name,void *value,size_t offset)

{
  iterator iVar1;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<CPU::Z80::State::ExecutionState>::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<CPU::Z80::State::ExecutionState>::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&contents__abi_cxx11_._M_h,name);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<CPU::Z80::State::ExecutionState>::Field>,_true>
      ._M_cur == (__node_type *)0x0) {
    return;
  }
  if (offset < *(ulong *)((long)iVar1.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<CPU::Z80::State::ExecutionState>::Field>,_true>
                                ._M_cur + 0x40)) {
    memcpy((void *)((long)&(this->super_Struct)._vptr_Struct +
                   offset * *(size_t *)
                             ((long)iVar1.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<CPU::Z80::State::ExecutionState>::Field>,_true>
                                    ._M_cur + 0x38) +
                   *(long *)((long)iVar1.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<CPU::Z80::State::ExecutionState>::Field>,_true>
                                   ._M_cur + 0x30)),value,
           *(size_t *)
            ((long)iVar1.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<CPU::Z80::State::ExecutionState>::Field>,_true>
                   ._M_cur + 0x38));
    return;
  }
  __assert_fail("offset < iterator->second.count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Processors/Z80/State/../../../Reflection/Struct.hpp"
                ,0xab,
                "virtual void Reflection::StructImpl<CPU::Z80::State::ExecutionState>::set(const std::string &, const void *, size_t) [Owner = CPU::Z80::State::ExecutionState]"
               );
}

Assistant:

void set(const std::string &name, const void *value, size_t offset) final {
			const auto iterator = contents_.find(name);
			if(iterator == contents_.end()) return;
			assert(offset < iterator->second.count);
			memcpy(reinterpret_cast<uint8_t *>(this) + iterator->second.offset + offset * iterator->second.size, value, iterator->second.size);
		}